

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg_structurizer.cpp
# Opt level: O2

void __thiscall dxil_spv::CFGStructurizer::backwards_visit(CFGStructurizer *this,CFGNode *entry)

{
  pointer ppCVar1;
  pointer ppCVar2;
  CFGNode *local_28;
  
  entry->backward_visited = true;
  ppCVar1 = (entry->pred).
            super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  for (ppCVar2 = (entry->pred).
                 super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppCVar2 != ppCVar1;
      ppCVar2 = ppCVar2 + 1) {
    if ((*ppCVar2)->backward_visited == false) {
      backwards_visit(this,*ppCVar2);
    }
  }
  ppCVar1 = (entry->fake_pred).
            super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  for (ppCVar2 = (entry->fake_pred).
                 super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppCVar2 != ppCVar1;
      ppCVar2 = ppCVar2 + 1) {
    if ((*ppCVar2)->backward_visited == false) {
      backwards_visit(this,*ppCVar2);
    }
  }
  entry->backward_post_visit_order =
       (uint32_t)
       ((ulong)((long)(this->backward_post_visit_order).
                      super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
               (long)(this->backward_post_visit_order).
                     super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                     ._M_impl.super__Vector_impl_data._M_start) >> 3);
  local_28 = entry;
  std::vector<dxil_spv::CFGNode*,dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode*>>::
  emplace_back<dxil_spv::CFGNode*>
            ((vector<dxil_spv::CFGNode*,dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode*>> *)
             &this->backward_post_visit_order,&local_28);
  return;
}

Assistant:

void CFGStructurizer::backwards_visit(CFGNode &entry)
{
	entry.backward_visited = true;

	for (auto *pred : entry.pred)
		if (!pred->backward_visited)
			backwards_visit(*pred);

	for (auto *pred : entry.fake_pred)
		if (!pred->backward_visited)
			backwards_visit(*pred);

	entry.backward_post_visit_order = backward_post_visit_order.size();
	backward_post_visit_order.push_back(&entry);
}